

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O1

pboolean p_tree_bst_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  PTreeBaseNode *pPVar1;
  pint pVar2;
  pboolean pVar3;
  PTreeBaseNode_ *pPVar4;
  
  pPVar1 = *root_node;
  while (pPVar1 != (PTreeBaseNode *)0x0) {
    pVar2 = (*compare_func)(key,pPVar1->key,data);
    if (pVar2 < 0) {
      root_node = &((PTreeBaseNode_ *)root_node)->left->left;
    }
    else {
      if (pVar2 == 0) break;
      root_node = &((PTreeBaseNode_ *)root_node)->left->right;
    }
    pPVar1 = ((PTreeBaseNode_ *)root_node)->left;
  }
  if (((PTreeBaseNode_ *)root_node)->left == (PTreeBaseNode_ *)0x0) {
    pPVar4 = (PTreeBaseNode_ *)p_malloc0(0x20);
    ((PTreeBaseNode_ *)root_node)->left = pPVar4;
    if (pPVar4 == (PTreeBaseNode_ *)0x0) {
      return 0;
    }
    pVar3 = 1;
  }
  else {
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(((PTreeBaseNode_ *)root_node)->left->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(((PTreeBaseNode_ *)root_node)->left->value);
    }
    pPVar4 = ((PTreeBaseNode_ *)root_node)->left;
    pVar3 = 0;
  }
  pPVar4->key = key;
  ((PTreeBaseNode_ *)root_node)->left->value = value;
  return pVar3;
}

Assistant:

pboolean
p_tree_bst_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	pint		cmp_result;

	cur_node = root_node;

	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0)
			cur_node = &(*cur_node)->left;
		else if (cmp_result > 0)
			cur_node = &(*cur_node)->right;
		else
			break;
	}

	if ((*cur_node) == NULL) {
		if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeBaseNode))) == NULL))
			return FALSE;

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return TRUE;
	} else {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}
}